

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_GetGlyphKernAdvance(stbtt_fontinfo *info,int g1,int g2)

{
  ushort uVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ushort uVar12;
  ushort uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong local_68;
  
  lVar10 = (long)info->gpos;
  uVar16 = 0;
  uVar9 = 0;
  if (((lVar10 != 0) &&
      (puVar2 = info->data, uVar9 = uVar16,
      (ushort)(*(ushort *)(puVar2 + lVar10) << 8 | *(ushort *)(puVar2 + lVar10) >> 8) == 1)) &&
     (puVar2[lVar10 + 3] == '\0' && puVar2[lVar10 + 2] == '\0')) {
    uVar20 = (ulong)(ushort)(*(ushort *)(puVar2 + lVar10 + 8) << 8 |
                            *(ushort *)(puVar2 + lVar10 + 8) >> 8);
    uVar12 = *(ushort *)(puVar2 + uVar20 + lVar10) << 8 | *(ushort *)(puVar2 + uVar20 + lVar10) >> 8
    ;
    if (uVar12 != 0) {
      lVar10 = uVar20 + lVar10;
      local_68 = 0;
      do {
        uVar20 = (ulong)(ushort)(*(ushort *)(puVar2 + local_68 * 2 + lVar10 + 2) << 8 |
                                *(ushort *)(puVar2 + local_68 * 2 + lVar10 + 2) >> 8);
        if (((ushort)(*(ushort *)(puVar2 + uVar20 + lVar10) << 8 |
                     *(ushort *)(puVar2 + uVar20 + lVar10) >> 8) == 2) &&
           (uVar7 = *(ushort *)(puVar2 + uVar20 + lVar10 + 4) << 8 |
                    *(ushort *)(puVar2 + uVar20 + lVar10 + 4) >> 8, uVar7 != 0)) {
          lVar4 = uVar20 + lVar10;
          uVar20 = 0;
LAB_00132455:
          uVar11 = (ulong)(ushort)(*(ushort *)(puVar2 + uVar20 * 2 + lVar4 + 6) << 8 |
                                  *(ushort *)(puVar2 + uVar20 * 2 + lVar4 + 6) >> 8);
          lVar5 = uVar11 + lVar4;
          uVar15 = (ulong)(ushort)(*(ushort *)(puVar2 + uVar11 + lVar4 + 2) << 8 |
                                  *(ushort *)(puVar2 + uVar11 + lVar4 + 2) >> 8);
          lVar6 = uVar15 + lVar5;
          uVar13 = *(ushort *)(puVar2 + uVar15 + lVar5) << 8 |
                   *(ushort *)(puVar2 + uVar15 + lVar5) >> 8;
          if (uVar13 == 2) {
            uVar13 = *(ushort *)(puVar2 + lVar6 + 2) << 8 | *(ushort *)(puVar2 + lVar6 + 2) >> 8;
            if (uVar13 != 0) {
              iVar14 = uVar13 - 1;
              iVar17 = 0;
              do {
                iVar18 = iVar14 + iVar17 >> 1;
                lVar3 = (long)iVar18 * 6;
                uVar9 = (uint)(ushort)(*(ushort *)(puVar2 + lVar3 + lVar6 + 4) << 8 |
                                      *(ushort *)(puVar2 + lVar3 + lVar6 + 4) >> 8);
                if (g1 < (int)uVar9) {
                  iVar14 = iVar18 + -1;
                }
                else {
                  if ((uint)g1 <=
                      (uint)(ushort)(*(ushort *)(puVar2 + lVar3 + lVar6 + 6) << 8 |
                                    *(ushort *)(puVar2 + lVar3 + lVar6 + 6) >> 8)) {
                    iVar14 = (g1 - uVar9) +
                             (uint)(ushort)(*(ushort *)(puVar2 + lVar3 + lVar6 + 8) << 8 |
                                           *(ushort *)(puVar2 + lVar3 + lVar6 + 8) >> 8);
                    goto LAB_00132565;
                  }
                  iVar17 = iVar18 + 1;
                }
              } while (iVar17 <= iVar14);
            }
          }
          else {
            if (uVar13 != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                            ,0x92f,"stbtt_int32 stbtt__GetCoverageIndex(stbtt_uint8 *, int)");
            }
            uVar13 = *(ushort *)(puVar2 + lVar6 + 2) << 8 | *(ushort *)(puVar2 + lVar6 + 2) >> 8;
            if (uVar13 != 0) {
              iVar17 = uVar13 - 1;
              iVar18 = 0;
              do {
                iVar14 = iVar17 + iVar18 >> 1;
                uVar9 = (uint)(ushort)(*(ushort *)
                                        (puVar2 + ((long)(iVar17 + iVar18) & 0xfffffffffffffffeU) +
                                                  lVar6 + 4) << 8 |
                                      *(ushort *)
                                       (puVar2 + ((long)(iVar17 + iVar18) & 0xfffffffffffffffeU) +
                                                 lVar6 + 4) >> 8);
                if (g1 < (int)uVar9) {
                  iVar17 = iVar14 + -1;
                }
                else {
                  if ((uint)g1 <= uVar9) goto LAB_00132565;
                  iVar18 = iVar14 + 1;
                }
              } while (iVar18 <= iVar17);
            }
          }
          goto LAB_001326e6;
        }
LAB_001326f4:
        local_68 = local_68 + 1;
        uVar9 = 0;
      } while (local_68 != uVar12);
    }
  }
LAB_00132724:
  lVar10 = (long)info->kern;
  if (lVar10 != 0) {
    puVar2 = info->data;
    uVar16 = 0;
    if (((puVar2[lVar10 + 3] != '\0' || puVar2[lVar10 + 2] != '\0') &&
        (uVar16 = 0,
        (ushort)(*(ushort *)(puVar2 + lVar10 + 8) << 8 | *(ushort *)(puVar2 + lVar10 + 8) >> 8) == 1
        )) && (uVar12 = *(ushort *)(puVar2 + lVar10 + 10) << 8 |
                        *(ushort *)(puVar2 + lVar10 + 10) >> 8, uVar12 != 0)) {
      uVar16 = g1 << 0x10 | g2;
      iVar14 = uVar12 - 1;
      iVar17 = 0;
      do {
        iVar18 = iVar17 + iVar14 >> 1;
        lVar4 = (long)iVar18 * 6;
        uVar19 = *(uint *)(puVar2 + lVar4 + lVar10 + 0x12);
        uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18
        ;
        if (uVar16 < uVar19) {
          iVar14 = iVar18 + -1;
        }
        else {
          if (uVar16 <= uVar19) {
            uVar16 = (int)(short)((ushort)puVar2[lVar4 + lVar10 + 0x16] << 8) |
                     (uint)puVar2[lVar4 + lVar10 + 0x17];
            goto LAB_001327b2;
          }
          iVar17 = iVar18 + 1;
        }
      } while (iVar17 <= iVar14);
      uVar16 = 0;
    }
LAB_001327b2:
    uVar9 = uVar9 + uVar16;
  }
  return uVar9;
LAB_00132565:
  if (iVar14 != -1) {
    uVar13 = *(ushort *)(puVar2 + uVar11 + lVar4) << 8 | *(ushort *)(puVar2 + uVar11 + lVar4) >> 8;
    if (uVar13 == 2) {
      uVar13 = *(ushort *)(puVar2 + lVar5 + 4);
      uVar1 = *(ushort *)(puVar2 + lVar5 + 6);
      uVar8 = *(ushort *)(puVar2 + lVar5 + 10);
      uVar16 = stbtt__GetGlyphClass
                         (puVar2 + (ulong)(ushort)(*(ushort *)(puVar2 + lVar5 + 8) << 8 |
                                                  *(ushort *)(puVar2 + lVar5 + 8) >> 8) + lVar5,g1);
      uVar19 = stbtt__GetGlyphClass(puVar2 + (ulong)(ushort)(uVar8 << 8 | uVar8 >> 8) + lVar5,g2);
      if ((int)(uint)(ushort)(*(ushort *)(puVar2 + lVar5 + 0xc) << 8 |
                             *(ushort *)(puVar2 + lVar5 + 0xc) >> 8) <= (int)uVar16) {
        __assert_fail("glyph1class < class1Count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                      ,0x9c5,
                      "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                     );
      }
      uVar8 = *(ushort *)(puVar2 + lVar5 + 0xe) << 8 | *(ushort *)(puVar2 + lVar5 + 0xe) >> 8;
      if ((int)(uint)uVar8 <= (int)uVar19) {
        __assert_fail("glyph2class < class2Count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                      ,0x9c6,
                      "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                     );
      }
      uVar9 = 0;
      if (((ushort)(uVar13 << 8 | uVar13 >> 8) != 4) || ((uVar1 & 0xff) != 0 || uVar1 >> 8 != 0))
      goto LAB_00132724;
      if (-1 < (int)(uVar19 | uVar16)) {
        lVar5 = (ulong)(uVar16 * uVar8 * 2) + lVar5;
        lVar10 = (ulong)uVar19 * 2 + lVar5 + 0x10;
        lVar5 = (ulong)uVar19 * 2 + lVar5 + 0x11;
LAB_00132718:
        uVar9 = (int)(short)((ushort)puVar2[lVar10] << 8) | (uint)puVar2[lVar5];
        goto LAB_00132724;
      }
    }
    else {
      if (uVar13 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                      ,0x9d8,
                      "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                     );
      }
      uVar9 = 0;
      if (((ushort)(*(ushort *)(puVar2 + lVar5 + 4) << 8 | *(ushort *)(puVar2 + lVar5 + 4) >> 8) !=
           4) || ((*(ushort *)(puVar2 + lVar5 + 6) & 0xff) != 0 ||
                  *(ushort *)(puVar2 + lVar5 + 6) >> 8 != 0)) goto LAB_00132724;
      if ((int)(uint)(ushort)(*(ushort *)(puVar2 + lVar5 + 8) << 8 |
                             *(ushort *)(puVar2 + lVar5 + 8) >> 8) <= iVar14) {
        __assert_fail("coverageIndex < pairSetCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                      ,0x9a1,
                      "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                     );
      }
      uVar11 = (ulong)(ushort)(*(ushort *)(puVar2 + (long)iVar14 * 2 + lVar5 + 10) << 8 |
                              *(ushort *)(puVar2 + (long)iVar14 * 2 + lVar5 + 10) >> 8);
      uVar13 = *(ushort *)(puVar2 + uVar11 + lVar5) << 8 | *(ushort *)(puVar2 + uVar11 + lVar5) >> 8
      ;
      if (uVar13 != 0) {
        lVar6 = uVar11 + lVar5 + 2;
        iVar14 = uVar13 - 1;
        iVar17 = 0;
        do {
          iVar18 = iVar14 + iVar17 >> 1;
          lVar5 = iVar18 * 4 + lVar6;
          uVar9 = (uint)(ushort)(*(ushort *)(puVar2 + iVar18 * 4 + lVar6) << 8 |
                                *(ushort *)(puVar2 + iVar18 * 4 + lVar6) >> 8);
          if (g2 < (int)uVar9) {
            iVar14 = iVar18 + -1;
          }
          else {
            if ((uint)g2 <= uVar9) {
              lVar10 = lVar5 + 2;
              lVar5 = lVar5 + 3;
              goto LAB_00132718;
            }
            iVar17 = iVar18 + 1;
          }
        } while (iVar17 <= iVar14);
      }
    }
  }
LAB_001326e6:
  uVar20 = uVar20 + 1;
  if (uVar20 == uVar7) goto LAB_001326f4;
  goto LAB_00132455;
}

Assistant:

STBTT_DEF int  stbtt_GetGlyphKernAdvance(const stbtt_fontinfo *info, int g1, int g2)
{
   int xAdvance = 0;

   if (info->gpos)
      xAdvance += stbtt__GetGlyphGPOSInfoAdvance(info, g1, g2);

   if (info->kern)
      xAdvance += stbtt__GetGlyphKernInfoAdvance(info, g1, g2);

   return xAdvance;
}